

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesDH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  BrotliEncoderDictionary *pBVar10;
  void *pvVar11;
  void *pvVar12;
  HasherCommon *pHVar13;
  PreparedDictionary *pPVar14;
  uint8_t *puVar15;
  BrotliDictionary *pBVar16;
  size_t sVar17;
  int iVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  byte bVar24;
  ushort uVar25;
  ushort uVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  ulong *puVar30;
  char *pcVar31;
  size_t sVar32;
  uint32_t uVar33;
  uint uVar34;
  int iVar35;
  uint *puVar36;
  ulong uVar37;
  char cVar38;
  long lVar39;
  uint uVar40;
  size_t sVar41;
  byte bVar42;
  uint16_t uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong *puVar46;
  uint uVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  uint8_t *s1_orig_2;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  BankH40 *banks_1;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  int iVar60;
  uint8_t *s1_orig;
  ulong uVar61;
  ulong *puVar62;
  bool bVar63;
  ulong local_1a8;
  ulong local_198;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_110;
  size_t local_108;
  Command *local_100;
  ulong local_f8;
  int local_f0;
  uint local_ec;
  ulong local_e8;
  ulong local_c8;
  
  uVar21 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar6 = (position - 3) + num_bytes;
  sVar27 = position;
  if (3 < num_bytes) {
    sVar27 = uVar6;
  }
  uVar3 = position + num_bytes;
  lVar28 = 0x200;
  if (params->quality < 9) {
    lVar28 = 0x40;
  }
  uVar7 = (position - 4) + num_bytes;
  lVar5 = position - 1;
  sVar8 = params->stream_offset;
  local_108 = *last_insert_len;
  uVar59 = lVar28 + position;
  sVar9 = (params->dictionary).compound.total_size;
  lVar1 = sVar9 + 1;
  local_100 = commands;
LAB_00e02c6b:
LAB_00e02c79:
  uVar23 = position;
  if (uVar3 <= uVar23 + 4) {
    *last_insert_len = (local_108 + uVar3) - uVar23;
    *num_commands = *num_commands + ((long)local_100 - (long)commands >> 4);
    return;
  }
  uVar48 = uVar21;
  if (uVar23 < uVar21) {
    uVar48 = uVar23;
  }
  uVar49 = sVar8 + uVar23;
  if (uVar21 <= sVar8 + uVar23) {
    uVar49 = uVar21;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_ec = 0;
    local_c8 = 0;
    goto LAB_00e02d29;
  }
  if (uVar23 == 0) {
    local_c8 = 0;
LAB_00e02cfe:
    uVar55 = 0;
  }
  else {
    local_c8 = (ulong)ringbuffer[uVar23 - 1 & ringbuffer_mask];
    if (uVar23 == 1) goto LAB_00e02cfe;
    uVar55 = (ulong)ringbuffer[uVar23 - 2 & ringbuffer_mask];
  }
  local_ec = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar55 + 0x100] | literal_context_lut[local_c8]];
LAB_00e02d29:
  local_148 = uVar3 - uVar23;
  pBVar10 = (params->dictionary).contextual.dict[local_ec];
  uVar55 = (params->dist).max_distance;
  pvVar11 = (hasher->privat)._H40.extra[0];
  pvVar12 = (hasher->privat)._H40.extra[1];
  uVar44 = uVar23 & ringbuffer_mask;
  puVar62 = (ulong *)(ringbuffer + uVar44);
  uVar20 = (uint)(*(int *)(ringbuffer + uVar44) * 0x1e35a7bd) >> 0x11;
  uVar61 = 0x7e4;
  uVar51 = 0;
  uVar54 = 0;
  lVar50 = 0;
  local_198 = 0;
  do {
    cVar38 = (char)uVar20;
    if (lVar50 == 4) {
      uVar56 = (ulong)uVar20;
      sVar41 = (hasher->privat)._H5.block_size_;
      uVar53 = uVar23 - *(uint *)((long)pvVar11 + uVar56 * 4);
      uVar25 = *(ushort *)((long)pvVar11 + uVar56 * 2 + 0x20000);
      uVar58 = 0;
      uVar29 = uVar53;
      uVar45 = local_198;
      do {
        local_198 = uVar45;
        local_180 = uVar61;
        local_170 = uVar54;
        local_110 = uVar51;
        do {
          do {
            do {
              do {
                bVar63 = sVar41 == 0;
                sVar41 = sVar41 - 1;
                if ((bVar63) || (uVar58 = uVar58 + uVar29, uVar48 < uVar58)) {
                  uVar25 = (hasher->privat)._H42.free_slot_idx[0];
                  (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
                  if (0xfffe < uVar53) {
                    uVar53 = 0xffff;
                  }
                  *(char *)((long)pvVar11 + (uVar23 & 0xffff) + 0x30000) = cVar38;
                  *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar53;
                  *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
                       *(undefined2 *)((long)pvVar11 + uVar56 * 2 + 0x20000);
                  *(int *)((long)pvVar11 + uVar56 * 4) = (int)uVar23;
                  *(ushort *)((long)pvVar11 + uVar56 * 2 + 0x20000) = uVar25;
                  if (local_180 == 0x7e4) {
                    pHVar13 = (hasher->privat)._H5.common_;
                    uVar48 = pHVar13->dict_num_lookups;
                    local_178 = pHVar13->dict_num_matches;
                    local_180 = 0x7e4;
                    if (uVar48 >> 7 <= local_178) {
                      uVar51 = (ulong)((uint)((int)*puVar62 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      puVar15 = pBVar10->hash_table_lengths;
                      iVar35 = 0;
                      lVar50 = 0;
                      goto LAB_00e0357d;
                    }
                  }
                  iVar35 = 0;
                  goto LAB_00e030ae;
                }
                uVar51 = (ulong)uVar25;
                uVar25 = *(ushort *)((long)pvVar12 + uVar51 * 4 + 2);
                uVar29 = (ulong)*(ushort *)((long)pvVar12 + uVar51 * 4);
              } while (ringbuffer_mask < local_198 + uVar44);
              uVar51 = uVar23 - uVar58 & ringbuffer_mask;
              uVar54 = local_198 + uVar51;
            } while ((ringbuffer_mask < uVar54) ||
                    (ringbuffer[local_198 + uVar44] != ringbuffer[uVar54]));
            puVar30 = (ulong *)(ringbuffer + uVar51);
            lVar50 = 0;
            puVar46 = puVar62;
            uVar51 = local_148;
LAB_00e02f57:
            if (uVar51 < 8) {
              for (uVar54 = 0;
                  (uVar51 != uVar54 &&
                  (*(char *)((long)puVar30 + uVar54) == *(char *)((long)puVar46 + uVar54)));
                  uVar54 = uVar54 + 1) {
              }
            }
            else {
              if (*puVar46 == *puVar30) goto code_r0x00e02f69;
              uVar54 = *puVar30 ^ *puVar46;
              uVar51 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                }
              }
              uVar54 = uVar51 >> 3 & 0x1fffffff;
            }
            uVar54 = uVar54 - lVar50;
          } while (uVar54 < 4);
          iVar35 = 0x1f;
          if ((uint)uVar58 != 0) {
            for (; (uint)uVar58 >> iVar35 == 0; iVar35 = iVar35 + -1) {
            }
          }
          uVar61 = (ulong)(iVar35 * -0x1e + 0x780) + uVar54 * 0x87;
          uVar51 = uVar58;
          uVar45 = uVar54;
        } while (uVar61 <= local_180);
      } while( true );
    }
    uVar45 = (ulong)dist_cache[lVar50];
    uVar29 = uVar23 - uVar45;
    if ((((lVar50 == 0) || (*(char *)((long)pvVar11 + (uVar29 & 0xffff) + 0x30000) == cVar38)) &&
        (uVar45 <= uVar48)) && (uVar29 < uVar23)) {
      puVar30 = (ulong *)(ringbuffer + (uVar29 & ringbuffer_mask));
      lVar39 = 0;
      uVar29 = local_148;
      puVar46 = puVar62;
LAB_00e02de4:
      if (uVar29 < 8) {
        for (uVar58 = 0;
            (uVar29 != uVar58 &&
            (*(char *)((long)puVar30 + uVar58) == *(char *)((long)puVar46 + uVar58)));
            uVar58 = uVar58 + 1) {
        }
      }
      else {
        if (*puVar46 == *puVar30) goto code_r0x00e02df6;
        uVar58 = *puVar30 ^ *puVar46;
        uVar29 = 0;
        if (uVar58 != 0) {
          for (; (uVar58 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar58 = uVar29 >> 3 & 0x1fffffff;
      }
      uVar58 = uVar58 - lVar39;
      if ((1 < uVar58) && (uVar29 = uVar58 * 0x87 + 0x78f, uVar61 < uVar29)) {
        if (lVar50 != 0) {
          uVar29 = uVar29 - ((0x1ca10U >> ((byte)lVar50 & 2) & 4) + 0x27);
        }
        if (uVar61 < uVar29) {
          uVar51 = uVar45;
          uVar54 = uVar58;
          uVar61 = uVar29;
          local_198 = uVar58;
        }
      }
    }
    lVar50 = lVar50 + 1;
  } while( true );
LAB_00e0357d:
  if (lVar50 == 2) goto LAB_00e030ae;
  uVar48 = uVar48 + 1;
  pHVar13->dict_num_lookups = uVar48;
  bVar24 = puVar15[uVar51];
  uVar54 = (ulong)bVar24;
  if ((uVar54 != 0) && (uVar54 <= local_148)) {
    pBVar16 = pBVar10->words;
    puVar30 = (ulong *)(pBVar16->data +
                       (ulong)pBVar16->offsets_by_length[uVar54] +
                       pBVar10->hash_table_words[uVar51] * uVar54);
    lVar39 = 0;
    uVar61 = uVar54;
    puVar46 = puVar62;
LAB_00e035f8:
    if (uVar61 < 8) {
      for (uVar61 = 0;
          ((bVar24 & 7) != uVar61 &&
          (*(char *)((long)puVar46 + uVar61) == *(char *)((long)puVar30 + uVar61)));
          uVar61 = uVar61 + 1) {
      }
    }
    else {
      if (*puVar30 == *puVar46) goto code_r0x00e0360a;
      uVar29 = *puVar46 ^ *puVar30;
      uVar61 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
        }
      }
      uVar61 = uVar61 >> 3 & 0x1fffffff;
    }
    uVar61 = uVar61 - lVar39;
    if (((uVar61 != 0) && (uVar54 < pBVar10->cutoffTransformsCount + uVar61)) &&
       (uVar54 = (ulong)pBVar10->hash_table_words[uVar51] + uVar49 + lVar1 +
                 ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                ((char)(uVar54 - uVar61) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar54 - uVar61) * 4 << (pBVar16->size_bits_by_length[uVar54] & 0x3f)),
       uVar54 <= uVar55)) {
      iVar60 = 0x1f;
      if ((uint)uVar54 != 0) {
        for (; (uint)uVar54 >> iVar60 == 0; iVar60 = iVar60 + -1) {
        }
      }
      uVar29 = (uVar61 * 0x87 - (ulong)(uint)(iVar60 * 0x1e)) + 0x780;
      if (local_180 <= uVar29) {
        iVar35 = (uint)bVar24 - (int)uVar61;
        local_178 = local_178 + 1;
        pHVar13->dict_num_matches = local_178;
        local_180 = uVar29;
        local_110 = uVar54;
        local_170 = uVar61;
      }
    }
  }
  lVar50 = lVar50 + 1;
  uVar51 = uVar51 + 1;
  goto LAB_00e0357d;
code_r0x00e0360a:
  puVar30 = puVar30 + 1;
  puVar46 = puVar46 + 1;
  uVar61 = uVar61 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e035f8;
LAB_00e030ae:
  local_140 = (params->dist).max_distance;
  sVar41 = 0;
LAB_00e030d9:
  if (sVar41 != (params->dictionary).compound.num_chunks) {
    pPVar14 = (params->dictionary).compound.chunks[sVar41];
    bVar24 = (byte)pPVar14->bucket_bits;
    bVar42 = (byte)pPVar14->slot_bits;
    bVar19 = -(char)pPVar14->hash_bits;
    uVar48 = ((*puVar62 << (bVar19 & 0x3f)) >> (bVar19 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar24 & 0x3f);
    lVar50 = (1L << (bVar42 & 0x3f)) * 4;
    lVar39 = (1L << (bVar24 & 0x3f)) * 2;
    bVar42 = -bVar42;
    uVar20 = (uint)*(ushort *)((long)&pPVar14[1].magic + (uVar48 & 0xffffffff) * 2 + lVar50);
    puVar22 = (undefined8 *)
              ((long)&pPVar14[1].magic + (ulong)pPVar14->num_items * 4 + lVar39 + lVar50);
    if (pPVar14->magic != 0xdebcede0) {
      puVar22 = (undefined8 *)*puVar22;
    }
    uVar51 = (uVar49 + (params->dictionary).compound.total_size) -
             (params->dictionary).compound.chunk_offsets[sVar41];
    uVar55 = (ulong)pPVar14->source_size;
    puVar36 = (uint *)((long)&pPVar14[1].magic +
                      (ulong)(uVar20 + (&pPVar14[1].magic)
                                       [(uint)((int)uVar48 << (bVar42 & 0x1f)) >> (bVar42 & 0x1f)])
                      * 4 + lVar39 + lVar50);
    uVar20 = (uint)(uVar20 == 0xffff);
    lVar50 = 0;
    local_1a8 = local_180;
    local_198 = local_170;
    do {
      if (lVar50 == 4) {
        do {
          do {
            do {
              do {
                if (uVar20 != 0) {
                  sVar41 = sVar41 + 1;
                  goto LAB_00e030d9;
                }
                uVar20 = *puVar36;
                puVar36 = puVar36 + 1;
                uVar54 = (ulong)(uVar20 & 0x7fffffff);
                uVar20 = uVar20 & 0x80000000;
                uVar61 = uVar51 - uVar54;
                uVar48 = uVar55 - uVar54;
                if (local_148 <= uVar55 - uVar54) {
                  uVar48 = local_148;
                }
              } while (((local_140 < uVar61) || (ringbuffer_mask < uVar44 + local_198)) ||
                      ((uVar48 <= local_198 ||
                       (ringbuffer[uVar44 + local_198] !=
                        *(uint8_t *)((long)puVar22 + local_198 + uVar54)))));
              lVar50 = (long)puVar22 + uVar54;
              uVar45 = 0;
              lVar39 = 0;
              uVar29 = uVar48;
              puVar46 = puVar62;
LAB_00e03374:
              if (7 < uVar29) {
                if (*puVar46 == *(ulong *)(lVar50 + uVar45)) goto code_r0x00e03387;
                uVar54 = *(ulong *)(lVar50 + uVar45) ^ *puVar46;
                uVar48 = 0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                uVar48 = (uVar48 >> 3 & 0x1fffffff) - lVar39;
                goto LAB_00e033d5;
              }
              lVar39 = uVar54 + uVar48 + (long)puVar22;
              for (; uVar48 != uVar45; uVar45 = uVar45 + 1) {
                if (*(char *)(lVar50 + uVar45) != *(char *)((long)puVar62 + uVar45)) {
                  lVar39 = uVar45 + lVar50;
                  break;
                }
              }
              uVar48 = lVar39 - lVar50;
LAB_00e033d5:
            } while (uVar48 < 4);
            iVar60 = 0x1f;
            if ((uint)uVar61 != 0) {
              for (; (uint)uVar61 >> iVar60 == 0; iVar60 = iVar60 + -1) {
              }
            }
            uVar54 = (ulong)(iVar60 * -0x1e + 0x780) + uVar48 * 0x87;
          } while (uVar54 <= local_1a8);
          iVar35 = 0;
          local_1a8 = uVar54;
          local_198 = uVar48;
          local_180 = uVar54;
          local_170 = uVar48;
          local_110 = uVar61;
        } while( true );
      }
      uVar48 = (ulong)dist_cache[lVar50];
      if ((uVar51 - uVar55 < uVar48) && (lVar39 = uVar51 - uVar48, uVar48 <= uVar51)) {
        uVar54 = uVar55 - lVar39;
        if (local_148 <= uVar55 - lVar39) {
          uVar54 = local_148;
        }
        uVar29 = 0;
        uVar61 = uVar54;
LAB_00e03206:
        if (uVar61 < 8) {
          for (pcVar31 = (char *)((long)puVar22 + uVar29 + lVar39);
              (uVar54 != uVar29 && (*pcVar31 == *(char *)((long)puVar62 + uVar29)));
              pcVar31 = pcVar31 + 1) {
            uVar29 = uVar29 + 1;
          }
        }
        else {
          uVar45 = *(ulong *)((long)puVar22 + uVar29 + lVar39);
          if (*(ulong *)((long)puVar62 + uVar29) == uVar45) goto code_r0x00e03219;
          uVar45 = uVar45 ^ *(ulong *)((long)puVar62 + uVar29);
          uVar54 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
            }
          }
          uVar29 = uVar29 + (uVar54 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar29) && (uVar54 = uVar29 * 0x87 + 0x78f, local_1a8 < uVar54)) {
          if (lVar50 != 0) {
            uVar54 = uVar54 - ((0x1ca10U >> ((byte)lVar50 & 2) & 4) + 0x27);
          }
          if (local_1a8 < uVar54) {
            if (local_198 < uVar29) {
              local_198 = uVar29;
            }
            iVar35 = 0;
            local_110 = uVar48;
            local_170 = uVar29;
            local_180 = uVar54;
            local_1a8 = uVar54;
          }
        }
      }
      lVar50 = lVar50 + 1;
    } while( true );
  }
  if (local_180 < 0x7e5) {
    local_108 = local_108 + 1;
    position = uVar23 + 1;
    if (uVar59 < position) {
      if ((uint)((int)lVar28 * 4) + uVar59 < position) {
        uVar48 = uVar23 + 0x11;
        if (uVar7 <= uVar23 + 0x11) {
          uVar48 = uVar7;
        }
        for (; position < uVar48; position = position + 4) {
          pvVar11 = (hasher->privat)._H40.extra[0];
          pvVar12 = (hasher->privat)._H40.extra[1];
          uVar20 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar20;
          uVar25 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
          uVar49 = position - *(uint *)((long)pvVar11 + uVar23 * 4);
          *(char *)((long)pvVar11 + (position & 0xffff) + 0x30000) = (char)uVar20;
          if (0xfffe < uVar49) {
            uVar49 = 0xffff;
          }
          *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar49;
          *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
               *(undefined2 *)((long)pvVar11 + uVar23 * 2 + 0x20000);
          *(int *)((long)pvVar11 + uVar23 * 4) = (int)position;
          *(ushort *)((long)pvVar11 + uVar23 * 2 + 0x20000) = uVar25;
          local_108 = local_108 + 4;
        }
      }
      else {
        uVar48 = uVar23 + 9;
        if (uVar6 <= uVar23 + 9) {
          uVar48 = uVar6;
        }
        for (; position < uVar48; position = position + 2) {
          pvVar11 = (hasher->privat)._H40.extra[0];
          pvVar12 = (hasher->privat)._H40.extra[1];
          uVar20 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar20;
          uVar25 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
          uVar49 = position - *(uint *)((long)pvVar11 + uVar23 * 4);
          *(char *)((long)pvVar11 + (position & 0xffff) + 0x30000) = (char)uVar20;
          if (0xfffe < uVar49) {
            uVar49 = 0xffff;
          }
          *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar49;
          *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
               *(undefined2 *)((long)pvVar11 + uVar23 * 2 + 0x20000);
          *(int *)((long)pvVar11 + uVar23 * 4) = (int)position;
          *(ushort *)((long)pvVar11 + uVar23 * 2 + 0x20000) = uVar25;
          local_108 = local_108 + 2;
        }
      }
    }
    goto LAB_00e02c79;
  }
  uVar48 = local_108 + 4;
  uVar59 = sVar8 + 1 + uVar23;
  local_f8 = (lVar5 + num_bytes) - uVar23;
  local_f0 = 0;
  uVar25 = (hasher->privat)._H42.free_slot_idx[0];
LAB_00e0380f:
  uVar49 = uVar21;
  if (uVar59 < uVar21) {
    uVar49 = uVar59;
  }
  local_148 = local_148 - 1;
  local_1a8 = local_170 - 1;
  if (local_148 <= local_170 - 1) {
    local_1a8 = local_148;
  }
  if (4 < params->quality) {
    local_1a8 = 0;
  }
  uVar55 = uVar23 + 1;
  uVar51 = uVar21;
  if (uVar55 < uVar21) {
    uVar51 = uVar55;
  }
  local_e8 = sVar8 + uVar23 + 1;
  if (uVar21 <= local_e8) {
    local_e8 = uVar21;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_ec = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_c8 + 0x100] |
                      literal_context_lut[ringbuffer[uVar23 & ringbuffer_mask]]];
    local_c8 = (ulong)ringbuffer[uVar23 & ringbuffer_mask];
  }
  pBVar10 = (params->dictionary).contextual.dict[local_ec];
  pvVar11 = (hasher->privat)._H40.extra[0];
  pvVar12 = (hasher->privat)._H40.extra[1];
  uVar29 = uVar55 & ringbuffer_mask;
  puVar62 = (ulong *)(ringbuffer + uVar29);
  uVar20 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0x11;
  uVar44 = 0x7e4;
  uVar54 = 0;
  uVar61 = 0;
  lVar50 = 0;
  do {
    cVar38 = (char)uVar20;
    if (lVar50 == 4) {
      uVar52 = (ulong)uVar20;
      sVar41 = (hasher->privat)._H5.block_size_;
      uVar53 = uVar55 - *(uint *)((long)pvVar11 + uVar52 * 4);
      uVar26 = *(ushort *)((long)pvVar11 + uVar52 * 2 + 0x20000);
      uVar56 = 0;
      uVar45 = uVar53;
      uVar58 = local_1a8;
      do {
        uVar37 = uVar44;
        uVar57 = uVar58;
        local_1a8 = uVar61;
        local_168 = uVar54;
        uVar4 = uVar57 + uVar29;
        do {
          do {
            do {
              do {
                bVar63 = sVar41 == 0;
                sVar41 = sVar41 - 1;
                if ((bVar63) || (uVar56 = uVar56 + uVar45, uVar51 < uVar56)) {
                  (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
                  *(char *)((long)pvVar11 + (uVar55 & 0xffff) + 0x30000) = cVar38;
                  if (0xfffe < uVar53) {
                    uVar53 = 0xffff;
                  }
                  *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar53;
                  *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
                       *(undefined2 *)((long)pvVar11 + uVar52 * 2 + 0x20000);
                  *(int *)((long)pvVar11 + uVar52 * 4) = (int)uVar55;
                  *(ushort *)((long)pvVar11 + uVar52 * 2 + 0x20000) = uVar25;
                  iVar60 = 0;
                  if (uVar37 != 0x7e4) goto LAB_00e03e67;
                  pHVar13 = (hasher->privat)._H5.common_;
                  uVar51 = pHVar13->dict_num_lookups;
                  local_150 = pHVar13->dict_num_matches;
                  if (uVar51 >> 7 <= local_150) {
                    uVar54 = (ulong)((uint)((int)*puVar62 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    puVar15 = pBVar10->hash_table_lengths;
                    uVar37 = 0x7e4;
                    iVar60 = 0;
                    lVar50 = 0;
                    goto LAB_00e03cbb;
                  }
                  uVar37 = 0x7e4;
                  goto LAB_00e03e67;
                }
                uVar54 = (ulong)uVar26;
                uVar26 = *(ushort *)((long)pvVar12 + uVar54 * 4 + 2);
                uVar45 = (ulong)*(ushort *)((long)pvVar12 + uVar54 * 4);
              } while (ringbuffer_mask < uVar4);
              uVar61 = uVar55 - uVar56 & ringbuffer_mask;
              uVar54 = uVar61 + uVar57;
            } while ((ringbuffer_mask < uVar54) || (ringbuffer[uVar4] != ringbuffer[uVar54]));
            puVar30 = (ulong *)(ringbuffer + uVar61);
            lVar50 = 0;
            puVar46 = puVar62;
            uVar54 = local_148;
LAB_00e03b07:
            if (uVar54 < 8) {
              for (uVar61 = 0;
                  (uVar54 != uVar61 &&
                  (*(char *)((long)puVar30 + uVar61) == *(char *)((long)puVar46 + uVar61)));
                  uVar61 = uVar61 + 1) {
              }
            }
            else {
              if (*puVar46 == *puVar30) goto code_r0x00e03b19;
              uVar61 = *puVar30 ^ *puVar46;
              uVar54 = 0;
              if (uVar61 != 0) {
                for (; (uVar61 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              uVar61 = uVar54 >> 3 & 0x1fffffff;
            }
            uVar61 = uVar61 - lVar50;
          } while (uVar61 < 4);
          iVar60 = 0x1f;
          if ((uint)uVar56 != 0) {
            for (; (uint)uVar56 >> iVar60 == 0; iVar60 = iVar60 + -1) {
            }
          }
          uVar44 = (ulong)(iVar60 * -0x1e + 0x780) + uVar61 * 0x87;
          uVar54 = uVar56;
          uVar58 = uVar61;
        } while (uVar44 <= uVar37);
      } while( true );
    }
    uVar58 = (ulong)dist_cache[lVar50];
    uVar45 = uVar55 - uVar58;
    if ((((lVar50 == 0) || (*(char *)((long)pvVar11 + (uVar45 & 0xffff) + 0x30000) == cVar38)) &&
        (uVar58 <= uVar51)) && (uVar45 < uVar55)) {
      puVar30 = (ulong *)(ringbuffer + (uVar45 & ringbuffer_mask));
      lVar39 = 0;
      uVar45 = local_148;
      puVar46 = puVar62;
LAB_00e03985:
      if (uVar45 < 8) {
        for (uVar56 = 0;
            (uVar45 != uVar56 &&
            (*(char *)((long)puVar30 + uVar56) == *(char *)((long)puVar46 + uVar56)));
            uVar56 = uVar56 + 1) {
        }
      }
      else {
        if (*puVar46 == *puVar30) goto code_r0x00e03997;
        uVar56 = *puVar30 ^ *puVar46;
        uVar45 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
          }
        }
        uVar56 = uVar45 >> 3 & 0x1fffffff;
      }
      uVar56 = uVar56 - lVar39;
      if ((1 < uVar56) && (uVar45 = uVar56 * 0x87 + 0x78f, uVar44 < uVar45)) {
        if (lVar50 != 0) {
          uVar45 = uVar45 - ((0x1ca10U >> ((byte)lVar50 & 2) & 4) + 0x27);
        }
        if (uVar44 < uVar45) {
          uVar54 = uVar58;
          uVar61 = uVar56;
          uVar44 = uVar45;
          local_1a8 = uVar56;
        }
      }
    }
    lVar50 = lVar50 + 1;
  } while( true );
code_r0x00e03387:
  puVar46 = puVar46 + 1;
  uVar29 = uVar29 - 8;
  lVar39 = lVar39 + -8;
  uVar45 = uVar45 + 8;
  goto LAB_00e03374;
code_r0x00e03219:
  uVar61 = uVar61 - 8;
  uVar29 = uVar29 + 8;
  goto LAB_00e03206;
LAB_00e03cbb:
  if (lVar50 == 2) goto LAB_00e03e67;
  uVar51 = uVar51 + 1;
  pHVar13->dict_num_lookups = uVar51;
  bVar24 = puVar15[uVar54];
  uVar61 = (ulong)bVar24;
  if ((uVar61 != 0) && (uVar61 <= local_148)) {
    pBVar16 = pBVar10->words;
    puVar30 = (ulong *)(pBVar16->data +
                       (ulong)pBVar16->offsets_by_length[uVar61] +
                       pBVar10->hash_table_words[uVar54] * uVar61);
    lVar39 = 0;
    puVar46 = puVar62;
    uVar44 = uVar61;
LAB_00e03d1f:
    if (uVar44 < 8) {
      for (uVar44 = 0;
          ((bVar24 & 7) != uVar44 &&
          (*(char *)((long)puVar46 + uVar44) == *(char *)((long)puVar30 + uVar44)));
          uVar44 = uVar44 + 1) {
      }
    }
    else {
      if (*puVar30 == *puVar46) goto code_r0x00e03d30;
      uVar45 = *puVar46 ^ *puVar30;
      uVar44 = 0;
      if (uVar45 != 0) {
        for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
        }
      }
      uVar44 = uVar44 >> 3 & 0x1fffffff;
    }
    uVar44 = uVar44 - lVar39;
    if (((uVar44 != 0) && (uVar61 < pBVar10->cutoffTransformsCount + uVar44)) &&
       (uVar61 = (ulong)pBVar10->hash_table_words[uVar54] + lVar1 + local_e8 +
                 ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                ((char)(uVar61 - uVar44) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar61 - uVar44) * 4 << (pBVar16->size_bits_by_length[uVar61] & 0x3f)),
       uVar61 <= local_140)) {
      iVar18 = 0x1f;
      if ((uint)uVar61 != 0) {
        for (; (uint)uVar61 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      uVar45 = (uVar44 * 0x87 - (ulong)(uint)(iVar18 * 0x1e)) + 0x780;
      if (uVar37 <= uVar45) {
        iVar60 = (uint)bVar24 - (int)uVar44;
        local_150 = local_150 + 1;
        pHVar13->dict_num_matches = local_150;
        uVar37 = uVar45;
        local_168 = uVar61;
        local_1a8 = uVar44;
      }
    }
  }
  lVar50 = lVar50 + 1;
  uVar54 = uVar54 + 1;
  goto LAB_00e03cbb;
LAB_00e03e67:
  local_140 = (params->dist).max_distance;
  sVar41 = (params->dictionary).compound.total_size;
  lVar50 = uVar49 + sVar41;
  sVar32 = 0;
LAB_00e03eab:
  if (sVar32 != (params->dictionary).compound.num_chunks) {
    pPVar14 = (params->dictionary).compound.chunks[sVar32];
    bVar24 = (byte)pPVar14->bucket_bits;
    bVar42 = (byte)pPVar14->slot_bits;
    bVar19 = -(char)pPVar14->hash_bits;
    uVar49 = ((*puVar62 << (bVar19 & 0x3f)) >> (bVar19 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar24 & 0x3f);
    lVar39 = (1L << (bVar42 & 0x3f)) * 4;
    lVar2 = (1L << (bVar24 & 0x3f)) * 2;
    bVar42 = -bVar42;
    uVar20 = (uint)*(ushort *)((long)&pPVar14[1].magic + (uVar49 & 0xffffffff) * 2 + lVar39);
    puVar22 = (undefined8 *)
              ((long)&pPVar14[1].magic + (ulong)pPVar14->num_items * 4 + lVar2 + lVar39);
    if (pPVar14->magic != 0xdebcede0) {
      puVar22 = (undefined8 *)*puVar22;
    }
    sVar17 = (params->dictionary).compound.chunk_offsets[sVar32];
    uVar54 = (local_e8 + sVar41) - sVar17;
    uVar51 = (ulong)pPVar14->source_size;
    puVar36 = (uint *)((long)&pPVar14[1].magic +
                      (ulong)(uVar20 + (&pPVar14[1].magic)
                                       [(uint)((int)uVar49 << (bVar42 & 0x1f)) >> (bVar42 & 0x1f)])
                      * 4 + lVar2 + lVar39);
    uVar20 = (uint)(uVar20 == 0xffff);
    lVar39 = 0;
    local_198 = uVar37;
    local_178 = local_1a8;
    do {
      if (lVar39 == 4) {
        do {
          do {
            do {
              do {
                if (uVar20 != 0) {
                  sVar32 = sVar32 + 1;
                  goto LAB_00e03eab;
                }
                uVar20 = *puVar36;
                puVar36 = puVar36 + 1;
                uVar44 = (ulong)(uVar20 & 0x7fffffff);
                uVar20 = uVar20 & 0x80000000;
                uVar61 = uVar54 - uVar44;
                uVar49 = uVar51 - uVar44;
                if (local_148 <= uVar51 - uVar44) {
                  uVar49 = local_148;
                }
              } while ((((local_140 < uVar61) || (ringbuffer_mask < uVar29 + local_178)) ||
                       (uVar49 <= local_178)) ||
                      (ringbuffer[uVar29 + local_178] !=
                       *(uint8_t *)((long)puVar22 + local_178 + uVar44)));
              puVar30 = (ulong *)(uVar44 + (long)puVar22);
              lVar39 = 0;
              puVar46 = puVar62;
LAB_00e04175:
              if (uVar49 < 8) {
                for (uVar44 = 0;
                    (uVar49 != uVar44 &&
                    (*(char *)((long)puVar30 + uVar44) == *(char *)((long)puVar46 + uVar44)));
                    uVar44 = uVar44 + 1) {
                }
                uVar44 = uVar44 - lVar39;
              }
              else {
                if (*puVar46 == *puVar30) goto code_r0x00e04187;
                uVar44 = *puVar30 ^ *puVar46;
                uVar49 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                  }
                }
                uVar44 = (uVar49 >> 3 & 0x1fffffff) - lVar39;
              }
            } while (uVar44 < 4);
            iVar18 = 0x1f;
            if ((uint)uVar61 != 0) {
              for (; (uint)uVar61 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar49 = (ulong)(iVar18 * -0x1e + 0x780) + uVar44 * 0x87;
          } while (uVar49 <= local_198);
          iVar60 = 0;
          uVar37 = uVar49;
          local_178 = uVar44;
          local_1a8 = uVar44;
          local_198 = uVar49;
          local_168 = uVar61;
        } while( true );
      }
      uVar49 = (ulong)dist_cache[lVar39];
      if ((uVar54 - uVar51 < uVar49) && (uVar49 <= uVar54)) {
        uVar61 = (uVar49 - uVar54) + uVar51;
        if (local_148 <= uVar61) {
          uVar61 = local_148;
        }
        lVar2 = (lVar50 - sVar17) - uVar49;
        uVar44 = 0;
LAB_00e0400e:
        if (uVar61 < 8) {
          pcVar31 = (char *)((long)puVar22 + uVar44 + lVar2);
          uVar61 = (sVar17 - lVar50) + uVar51 + uVar49;
          if (local_f8 < uVar61) {
            uVar61 = local_f8;
          }
          for (; (uVar61 != uVar44 && (*pcVar31 == *(char *)((long)puVar62 + uVar44)));
              pcVar31 = pcVar31 + 1) {
            uVar44 = uVar44 + 1;
          }
        }
        else {
          uVar45 = *(ulong *)((long)puVar22 + uVar44 + lVar2);
          if (*(ulong *)((long)puVar62 + uVar44) == uVar45) goto code_r0x00e04021;
          uVar45 = uVar45 ^ *(ulong *)((long)puVar62 + uVar44);
          uVar61 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
            }
          }
          uVar44 = uVar44 + (uVar61 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar44) && (uVar61 = uVar44 * 0x87 + 0x78f, local_198 < uVar61)) {
          if (lVar39 != 0) {
            uVar61 = uVar61 - ((0x1ca10U >> ((byte)lVar39 & 2) & 4) + 0x27);
          }
          if (local_198 < uVar61) {
            if (local_178 < uVar44) {
              local_178 = uVar44;
            }
            iVar60 = 0;
            local_1a8 = uVar44;
            uVar37 = uVar61;
            local_168 = uVar49;
            local_198 = uVar61;
          }
        }
      }
      lVar39 = lVar39 + 1;
    } while( true );
  }
  if (uVar37 < local_180 + 0xaf) {
    uVar55 = uVar23;
    local_1a8 = local_170;
    iVar60 = iVar35;
    sVar41 = local_108;
    local_e8 = uVar23 + sVar8;
    if (uVar21 <= uVar23 + sVar8) {
      local_e8 = uVar21;
    }
    goto LAB_00e0431e;
  }
  local_110 = local_168;
  sVar41 = uVar48;
  if (local_f0 == 3) goto LAB_00e0431e;
  local_108 = local_108 + 1;
  local_f0 = local_f0 + 1;
  uVar49 = uVar23 + 5;
  uVar59 = uVar59 + 1;
  local_f8 = local_f8 - 1;
  uVar23 = uVar55;
  local_170 = local_1a8;
  local_180 = uVar37;
  sVar41 = local_108;
  iVar35 = iVar60;
  uVar25 = uVar25 + 1;
  if (uVar3 <= uVar49) goto LAB_00e0431e;
  goto LAB_00e0380f;
code_r0x00e04187:
  puVar46 = puVar46 + 1;
  puVar30 = puVar30 + 1;
  uVar49 = uVar49 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e04175;
code_r0x00e04021:
  uVar61 = uVar61 - 8;
  uVar44 = uVar44 + 8;
  goto LAB_00e0400e;
LAB_00e0431e:
  local_108 = sVar41;
  local_e8 = local_e8 + sVar9;
  if (local_e8 < local_110) {
LAB_00e04336:
    uVar59 = local_110 + 0xf;
  }
  else {
    if (local_110 == (long)*dist_cache) {
      uVar59 = 0;
      goto LAB_00e04372;
    }
    uVar59 = 1;
    if (local_110 != (long)dist_cache[1]) {
      uVar59 = (local_110 + 3) - (long)*dist_cache;
      if (uVar59 < 7) {
        bVar24 = (byte)((int)uVar59 << 2);
        uVar20 = 0x9750468;
      }
      else {
        uVar59 = (local_110 + 3) - (long)dist_cache[1];
        if (6 < uVar59) {
          uVar59 = 2;
          if ((local_110 != (long)dist_cache[2]) && (uVar59 = 3, local_110 != (long)dist_cache[3]))
          goto LAB_00e04336;
          goto LAB_00e0433a;
        }
        bVar24 = (byte)((int)uVar59 << 2);
        uVar20 = 0xfdb1ace;
      }
      uVar59 = (ulong)(uVar20 >> (bVar24 & 0x1f) & 0xf);
    }
  }
LAB_00e0433a:
  if ((local_110 <= local_e8) && (uVar59 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_110;
  }
LAB_00e04372:
  uVar20 = (uint)local_108;
  local_100->insert_len_ = uVar20;
  local_100->copy_len_ = iVar60 << 0x19 | (uint)local_1a8;
  uVar48 = (ulong)(params->dist).num_direct_distance_codes;
  uVar23 = uVar48 + 0x10;
  uVar33 = 0;
  if (uVar23 <= uVar59) {
    uVar40 = (params->dist).distance_postfix_bits;
    bVar24 = (byte)uVar40;
    uVar48 = ((4L << (bVar24 & 0x3f)) + (uVar59 - uVar48)) - 0x10;
    uVar47 = 0x1f;
    uVar34 = (uint)uVar48;
    if (uVar34 != 0) {
      for (; uVar34 >> uVar47 == 0; uVar47 = uVar47 - 1) {
      }
    }
    uVar47 = (uVar47 ^ 0xffffffe0) + 0x1f;
    uVar49 = (ulong)((uVar48 >> ((ulong)uVar47 & 0x3f) & 1) != 0);
    lVar50 = (ulong)uVar47 - (ulong)uVar40;
    uVar59 = (~(-1 << (bVar24 & 0x1f)) & uVar34) + uVar23 +
             (uVar49 + lVar50 * 2 + 0xfffe << (bVar24 & 0x3f)) | lVar50 * 0x400;
    uVar33 = (uint32_t)(uVar48 - (uVar49 + 2 << ((byte)uVar47 & 0x3f)) >> (bVar24 & 0x3f));
  }
  local_100->dist_prefix_ = (uint16_t)uVar59;
  local_100->dist_extra_ = uVar33;
  if (5 < local_108) {
    if (local_108 < 0x82) {
      uVar20 = 0x1f;
      uVar40 = (uint)(local_108 - 2);
      if (uVar40 != 0) {
        for (; uVar40 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = (int)(local_108 - 2 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar20 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_108 < 0x842) {
      uVar40 = 0x1f;
      if (uVar20 - 0x42 != 0) {
        for (; uVar20 - 0x42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar20 = (uVar40 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar20 = 0x15;
      if (0x1841 < local_108) {
        uVar20 = (uint)(ushort)(0x17 - (local_108 < 0x5842));
      }
    }
  }
  uVar40 = iVar60 + (uint)local_1a8;
  if (uVar40 < 10) {
    uVar47 = uVar40 - 2;
  }
  else if (uVar40 < 0x86) {
    uVar40 = uVar40 - 6;
    uVar47 = 0x1f;
    if (uVar40 != 0) {
      for (; uVar40 >> uVar47 == 0; uVar47 = uVar47 - 1) {
      }
    }
    uVar47 = (uVar40 >> ((char)(uVar47 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
             (uVar47 ^ 0xffffffe0) * 2;
  }
  else {
    uVar47 = 0x17;
    if (uVar40 < 0x846) {
      uVar47 = 0x1f;
      if (uVar40 - 0x46 != 0) {
        for (; uVar40 - 0x46 >> uVar47 == 0; uVar47 = uVar47 - 1) {
        }
      }
      uVar47 = (uVar47 ^ 0xffe0) + 0x2c;
    }
  }
  uVar25 = (ushort)uVar47;
  uVar43 = (uVar25 & 7) + ((ushort)uVar20 & 7) * 8;
  if ((((uVar59 & 0x3ff) == 0) && ((ushort)uVar20 < 8)) && (uVar25 < 0x10)) {
    if (7 < uVar25) {
      uVar43 = uVar43 + 0x40;
    }
  }
  else {
    iVar35 = ((uVar20 & 0xffff) >> 3) * 3 + ((uVar47 & 0xffff) >> 3);
    uVar43 = uVar43 + ((ushort)(0x520d40 >> ((char)iVar35 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar35 * 0x40 + 0x40;
  }
  local_100->cmd_prefix_ = uVar43;
  *num_literals = *num_literals + local_108;
  position = local_1a8 + uVar55;
  uVar23 = sVar27;
  if (position < sVar27) {
    uVar23 = position;
  }
  uVar48 = uVar55 + 2;
  if (local_110 < local_1a8 >> 2) {
    uVar59 = position + local_110 * -4;
    if (uVar59 < uVar48) {
      uVar59 = uVar48;
    }
    uVar48 = uVar59;
    if (uVar23 < uVar59) {
      uVar48 = uVar23;
    }
  }
  uVar59 = uVar55 + lVar28 + local_1a8 * 2;
  local_100 = local_100 + 1;
  for (; uVar48 < uVar23; uVar48 = uVar48 + 1) {
    pvVar11 = (hasher->privat)._H40.extra[0];
    pvVar12 = (hasher->privat)._H40.extra[1];
    uVar20 = (uint)(*(int *)(ringbuffer + (uVar48 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar49 = (ulong)uVar20;
    uVar25 = (hasher->privat)._H42.free_slot_idx[0];
    (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
    uVar55 = uVar48 - *(uint *)((long)pvVar11 + uVar49 * 4);
    *(char *)((long)pvVar11 + (uVar48 & 0xffff) + 0x30000) = (char)uVar20;
    if (0xfffe < uVar55) {
      uVar55 = 0xffff;
    }
    *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar55;
    *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
         *(undefined2 *)((long)pvVar11 + uVar49 * 2 + 0x20000);
    *(int *)((long)pvVar11 + uVar49 * 4) = (int)uVar48;
    *(ushort *)((long)pvVar11 + uVar49 * 2 + 0x20000) = uVar25;
  }
  local_108 = 0;
  goto LAB_00e02c6b;
code_r0x00e03d30:
  puVar30 = puVar30 + 1;
  puVar46 = puVar46 + 1;
  uVar44 = uVar44 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e03d1f;
code_r0x00e03b19:
  puVar46 = puVar46 + 1;
  puVar30 = puVar30 + 1;
  uVar54 = uVar54 - 8;
  lVar50 = lVar50 + -8;
  goto LAB_00e03b07;
code_r0x00e03997:
  puVar46 = puVar46 + 1;
  puVar30 = puVar30 + 1;
  uVar45 = uVar45 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e03985;
code_r0x00e02f69:
  puVar46 = puVar46 + 1;
  puVar30 = puVar30 + 1;
  uVar51 = uVar51 - 8;
  lVar50 = lVar50 + -8;
  goto LAB_00e02f57;
code_r0x00e02df6:
  puVar46 = puVar46 + 1;
  puVar30 = puVar30 + 1;
  uVar29 = uVar29 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e02de4;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}